

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall PhongShader::fragment(PhongShader *this,Model *model,vec3f bar,TGAColor *color)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  TGAColor TVar5;
  vec<3UL,_double> *pvVar6;
  double *pdVar7;
  double *pdVar8;
  mat<3UL,_3UL> *this_00;
  mat<2UL,_3UL> *lhs;
  vec<2UL,_double> vVar9;
  TGAColor local_29a [2];
  double local_290;
  double local_288;
  double local_280;
  double diff;
  vec<3UL,_double> local_260;
  undefined1 auStack_248 [8];
  vec3f n;
  undefined1 local_228 [8];
  mat<3UL,_3UL> B;
  undefined1 local_1c8 [8];
  vec3f j;
  undefined1 local_198 [8];
  vec3f i;
  mat<3UL,_3UL> AI;
  vec<3UL,_double> local_120;
  vec<3UL,_double> local_108;
  vec<3UL,_double> local_f0;
  vec<3UL,_double> local_d8;
  vec<3UL,_double> local_c0;
  undefined1 local_a8 [8];
  mat<3UL,_3UL> A;
  vec2f uv;
  undefined1 auStack_38 [8];
  vec3f bn;
  TGAColor *color_local;
  Model *model_local;
  PhongShader *this_local;
  
  bn.z = (double)color;
  operator*((vec<3UL,_double> *)&uv.y,&this->varying_nrm,&bar);
  pvVar6 = vec<3UL,_double>::normalize((vec<3UL,_double> *)&uv.y);
  bn.y = pvVar6->z;
  auStack_38 = (undefined1  [8])pvVar6->x;
  bn.x = pvVar6->y;
  lhs = &this->varying_uv;
  vVar9 = operator*(lhs,&bar);
  uv.x = vVar9.y;
  A.rows[2].z = vVar9.x;
  mat<3UL,_3UL>::mat((mat<3UL,_3UL> *)local_a8);
  this_00 = &this->ndc_tri;
  mat<3UL,_3UL>::col(&local_d8,this_00,1);
  mat<3UL,_3UL>::col(&local_f0,this_00,0);
  operator-(&local_c0,&local_d8,&local_f0);
  pvVar6 = mat<3UL,_3UL>::operator[]((mat<3UL,_3UL> *)local_a8,0);
  pvVar6->z = local_c0.z;
  pvVar6->x = local_c0.x;
  pvVar6->y = local_c0.y;
  mat<3UL,_3UL>::col(&local_120,this_00,2);
  pdVar1 = &AI.rows[2].z;
  mat<3UL,_3UL>::col((vec<3UL,_double> *)pdVar1,this_00,0);
  operator-(&local_108,&local_120,(vec<3UL,_double> *)pdVar1);
  pvVar6 = mat<3UL,_3UL>::operator[]((mat<3UL,_3UL> *)local_a8,1);
  pvVar6->z = local_108.z;
  pvVar6->x = local_108.x;
  pvVar6->y = local_108.y;
  pvVar6 = mat<3UL,_3UL>::operator[]((mat<3UL,_3UL> *)local_a8,2);
  pvVar6->z = bn.y;
  pvVar6->x = (double)auStack_38;
  pvVar6->y = bn.x;
  pdVar1 = &i.z;
  mat<3UL,_3UL>::invert((mat<3UL,_3UL> *)pdVar1,(mat<3UL,_3UL> *)local_a8);
  pvVar6 = mat<2UL,_3UL>::operator[](lhs,0);
  pdVar7 = vec<3UL,_double>::operator[](pvVar6,1);
  dVar2 = *pdVar7;
  pvVar6 = mat<2UL,_3UL>::operator[](lhs,0);
  pdVar7 = vec<3UL,_double>::operator[](pvVar6,0);
  dVar3 = *pdVar7;
  pvVar6 = mat<2UL,_3UL>::operator[](lhs,0);
  pdVar7 = vec<3UL,_double>::operator[](pvVar6,2);
  dVar4 = *pdVar7;
  pvVar6 = mat<2UL,_3UL>::operator[](lhs,0);
  pdVar7 = vec<3UL,_double>::operator[](pvVar6,0);
  vec<3UL,_double>::vec((vec<3UL,_double> *)&j.z,dVar2 - dVar3,dVar4 - *pdVar7,0.0);
  operator*((vec<3UL,_double> *)local_198,(mat<3UL,_3UL> *)pdVar1,(vec<3UL,_double> *)&j.z);
  pvVar6 = mat<2UL,_3UL>::operator[](lhs,1);
  pdVar7 = vec<3UL,_double>::operator[](pvVar6,1);
  dVar2 = *pdVar7;
  pvVar6 = mat<2UL,_3UL>::operator[](lhs,1);
  pdVar7 = vec<3UL,_double>::operator[](pvVar6,0);
  dVar3 = *pdVar7;
  pvVar6 = mat<2UL,_3UL>::operator[](lhs,1);
  pdVar7 = vec<3UL,_double>::operator[](pvVar6,2);
  dVar4 = *pdVar7;
  pvVar6 = mat<2UL,_3UL>::operator[](lhs,1);
  pdVar8 = vec<3UL,_double>::operator[](pvVar6,0);
  pdVar7 = &B.rows[2].z;
  vec<3UL,_double>::vec((vec<3UL,_double> *)pdVar7,dVar2 - dVar3,dVar4 - *pdVar8,0.0);
  operator*((vec<3UL,_double> *)local_1c8,(mat<3UL,_3UL> *)pdVar1,(vec<3UL,_double> *)pdVar7);
  mat<3UL,_3UL>::mat((mat<3UL,_3UL> *)local_228);
  pvVar6 = vec<3UL,_double>::normalize((vec<3UL,_double> *)local_198);
  mat<3UL,_3UL>::set_col((mat<3UL,_3UL> *)local_228,0,pvVar6);
  pvVar6 = vec<3UL,_double>::normalize((vec<3UL,_double> *)local_1c8);
  mat<3UL,_3UL>::set_col((mat<3UL,_3UL> *)local_228,1,pvVar6);
  mat<3UL,_3UL>::set_col((mat<3UL,_3UL> *)local_228,2,(vec<3UL,_double> *)auStack_38);
  pdVar1 = &A.rows[2].z;
  Model::normal((vec3f *)&diff,model,(vec2f *)pdVar1);
  operator*(&local_260,(mat<3UL,_3UL> *)local_228,(vec3f *)&diff);
  pvVar6 = vec<3UL,_double>::normalize(&local_260);
  n.y = pvVar6->z;
  auStack_248 = (undefined1  [8])pvVar6->x;
  n.x = pvVar6->y;
  local_288 = 0.0;
  local_290 = dot<3ul,double>((vec<3UL,_double> *)auStack_248,&light_dir);
  pdVar7 = std::max<double>(&local_288,&local_290);
  local_280 = *pdVar7;
  TVar5 = Model::diffuse(model,(vec2f *)pdVar1);
  local_29a[0].bgra = TVar5.bgra;
  local_29a[0].bytespp = TVar5.bytespp;
  TVar5 = TGAColor::operator*(local_29a,local_280);
  *(uint8_t (*) [4])bn.z = TVar5.bgra;
  *(uint8_t *)((long)bn.z + 4) = TVar5.bytespp;
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        vec3f bn = (varying_nrm * bar).normalize();
        vec2f uv = varying_uv * bar;

        mat<3, 3> A;
        A[0] = ndc_tri.col(1) - ndc_tri.col(0);
        A[1] = ndc_tri.col(2) - ndc_tri.col(0);
        A[2] = bn;

        mat<3, 3> AI = A.invert();

        vec3f i =
            AI * vec3f(varying_uv[0][1] - varying_uv[0][0], varying_uv[0][2] - varying_uv[0][0], 0);
        vec3f j =
            AI * vec3f(varying_uv[1][1] - varying_uv[1][0], varying_uv[1][2] - varying_uv[1][0], 0);

        mat<3, 3> B;
        B.set_col(0, i.normalize());
        B.set_col(1, j.normalize());
        B.set_col(2, bn);

        vec3f n = (B * model.normal(uv)).normalize();

        double diff = std::max(0., dot(n, light_dir));
        color = model.diffuse(uv) * diff;

        return false;
    }